

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O0

void __thiscall t_swift_generator::populate_reserved_words(t_swift_generator *this)

{
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar1;
  allocator local_17e1;
  value_type local_17e0;
  _Base_ptr local_17c0;
  undefined1 local_17b8;
  allocator local_17a9;
  value_type local_17a8;
  _Base_ptr local_1788;
  undefined1 local_1780;
  allocator local_1771;
  value_type local_1770;
  _Base_ptr local_1750;
  undefined1 local_1748;
  allocator local_1739;
  value_type local_1738;
  _Base_ptr local_1718;
  undefined1 local_1710;
  allocator local_1701;
  value_type local_1700;
  _Base_ptr local_16e0;
  undefined1 local_16d8;
  allocator local_16c9;
  value_type local_16c8;
  _Base_ptr local_16a8;
  undefined1 local_16a0;
  allocator local_1691;
  value_type local_1690;
  _Base_ptr local_1670;
  undefined1 local_1668;
  allocator local_1659;
  value_type local_1658;
  _Base_ptr local_1638;
  undefined1 local_1630;
  allocator local_1621;
  value_type local_1620;
  _Base_ptr local_1600;
  undefined1 local_15f8;
  allocator local_15e9;
  value_type local_15e8;
  _Base_ptr local_15c8;
  undefined1 local_15c0;
  allocator local_15b1;
  value_type local_15b0;
  _Base_ptr local_1590;
  undefined1 local_1588;
  allocator local_1579;
  value_type local_1578;
  _Base_ptr local_1558;
  undefined1 local_1550;
  allocator local_1541;
  value_type local_1540;
  _Base_ptr local_1520;
  undefined1 local_1518;
  allocator local_1509;
  value_type local_1508;
  _Base_ptr local_14e8;
  undefined1 local_14e0;
  allocator local_14d1;
  value_type local_14d0;
  _Base_ptr local_14b0;
  undefined1 local_14a8;
  allocator local_1499;
  value_type local_1498;
  _Base_ptr local_1478;
  undefined1 local_1470;
  allocator local_1461;
  value_type local_1460;
  _Base_ptr local_1440;
  undefined1 local_1438;
  allocator local_1429;
  value_type local_1428;
  _Base_ptr local_1408;
  undefined1 local_1400;
  allocator local_13f1;
  value_type local_13f0;
  _Base_ptr local_13d0;
  undefined1 local_13c8;
  allocator local_13b9;
  value_type local_13b8;
  _Base_ptr local_1398;
  undefined1 local_1390;
  allocator local_1381;
  value_type local_1380;
  _Base_ptr local_1360;
  undefined1 local_1358;
  allocator local_1349;
  value_type local_1348;
  _Base_ptr local_1328;
  undefined1 local_1320;
  allocator local_1311;
  value_type local_1310;
  _Base_ptr local_12f0;
  undefined1 local_12e8;
  allocator local_12d9;
  value_type local_12d8;
  _Base_ptr local_12b8;
  undefined1 local_12b0;
  allocator local_12a1;
  value_type local_12a0;
  _Base_ptr local_1280;
  undefined1 local_1278;
  allocator local_1269;
  value_type local_1268;
  _Base_ptr local_1248;
  undefined1 local_1240;
  allocator local_1231;
  value_type local_1230;
  _Base_ptr local_1210;
  undefined1 local_1208;
  allocator local_11f9;
  value_type local_11f8;
  _Base_ptr local_11d8;
  undefined1 local_11d0;
  allocator local_11c1;
  value_type local_11c0;
  _Base_ptr local_11a0;
  undefined1 local_1198;
  allocator local_1189;
  value_type local_1188;
  _Base_ptr local_1168;
  undefined1 local_1160;
  allocator local_1151;
  value_type local_1150;
  _Base_ptr local_1130;
  undefined1 local_1128;
  allocator local_1119;
  value_type local_1118;
  _Base_ptr local_10f8;
  undefined1 local_10f0;
  allocator local_10e1;
  value_type local_10e0;
  _Base_ptr local_10c0;
  undefined1 local_10b8;
  allocator local_10a9;
  value_type local_10a8;
  _Base_ptr local_1088;
  undefined1 local_1080;
  allocator local_1071;
  value_type local_1070;
  _Base_ptr local_1050;
  undefined1 local_1048;
  allocator local_1039;
  value_type local_1038;
  _Base_ptr local_1018;
  undefined1 local_1010;
  allocator local_1001;
  value_type local_1000;
  _Base_ptr local_fe0;
  undefined1 local_fd8;
  allocator local_fc9;
  value_type local_fc8;
  _Base_ptr local_fa8;
  undefined1 local_fa0;
  allocator local_f91;
  value_type local_f90;
  _Base_ptr local_f70;
  undefined1 local_f68;
  allocator local_f59;
  value_type local_f58;
  _Base_ptr local_f38;
  undefined1 local_f30;
  allocator local_f21;
  value_type local_f20;
  _Base_ptr local_f00;
  undefined1 local_ef8;
  allocator local_ee9;
  value_type local_ee8;
  _Base_ptr local_ec8;
  undefined1 local_ec0;
  allocator local_eb1;
  value_type local_eb0;
  _Base_ptr local_e90;
  undefined1 local_e88;
  allocator local_e79;
  value_type local_e78;
  _Base_ptr local_e58;
  undefined1 local_e50;
  allocator local_e41;
  value_type local_e40;
  _Base_ptr local_e20;
  undefined1 local_e18;
  allocator local_e09;
  value_type local_e08;
  _Base_ptr local_de8;
  undefined1 local_de0;
  allocator local_dd1;
  value_type local_dd0;
  _Base_ptr local_db0;
  undefined1 local_da8;
  allocator local_d99;
  value_type local_d98;
  _Base_ptr local_d78;
  undefined1 local_d70;
  allocator local_d61;
  value_type local_d60;
  _Base_ptr local_d40;
  undefined1 local_d38;
  allocator local_d29;
  value_type local_d28;
  _Base_ptr local_d08;
  undefined1 local_d00;
  allocator local_cf1;
  value_type local_cf0;
  _Base_ptr local_cd0;
  undefined1 local_cc8;
  allocator local_cb9;
  value_type local_cb8;
  _Base_ptr local_c98;
  undefined1 local_c90;
  allocator local_c81;
  value_type local_c80;
  _Base_ptr local_c60;
  undefined1 local_c58;
  allocator local_c49;
  value_type local_c48;
  _Base_ptr local_c28;
  undefined1 local_c20;
  allocator local_c11;
  value_type local_c10;
  _Base_ptr local_bf0;
  undefined1 local_be8;
  allocator local_bd9;
  value_type local_bd8;
  _Base_ptr local_bb8;
  undefined1 local_bb0;
  allocator local_ba1;
  value_type local_ba0;
  _Base_ptr local_b80;
  undefined1 local_b78;
  allocator local_b69;
  value_type local_b68;
  _Base_ptr local_b48;
  undefined1 local_b40;
  allocator local_b31;
  value_type local_b30;
  _Base_ptr local_b10;
  undefined1 local_b08;
  allocator local_af9;
  value_type local_af8;
  _Base_ptr local_ad8;
  undefined1 local_ad0;
  allocator local_ac1;
  value_type local_ac0;
  _Base_ptr local_aa0;
  undefined1 local_a98;
  allocator local_a89;
  value_type local_a88;
  _Base_ptr local_a68;
  undefined1 local_a60;
  allocator local_a51;
  value_type local_a50;
  _Base_ptr local_a30;
  undefined1 local_a28;
  allocator local_a19;
  value_type local_a18;
  _Base_ptr local_9f8;
  undefined1 local_9f0;
  allocator local_9e1;
  value_type local_9e0;
  _Base_ptr local_9c0;
  undefined1 local_9b8;
  allocator local_9a9;
  value_type local_9a8;
  _Base_ptr local_988;
  undefined1 local_980;
  allocator local_971;
  value_type local_970;
  _Base_ptr local_950;
  undefined1 local_948;
  allocator local_939;
  value_type local_938;
  _Base_ptr local_918;
  undefined1 local_910;
  allocator local_901;
  value_type local_900;
  _Base_ptr local_8e0;
  undefined1 local_8d8;
  allocator local_8c9;
  value_type local_8c8;
  _Base_ptr local_8a8;
  undefined1 local_8a0;
  allocator local_891;
  value_type local_890;
  _Base_ptr local_870;
  undefined1 local_868;
  allocator local_859;
  value_type local_858;
  _Base_ptr local_838;
  undefined1 local_830;
  allocator local_821;
  value_type local_820;
  _Base_ptr local_800;
  undefined1 local_7f8;
  allocator local_7e9;
  value_type local_7e8;
  _Base_ptr local_7c8;
  undefined1 local_7c0;
  allocator local_7b1;
  value_type local_7b0;
  _Base_ptr local_790;
  undefined1 local_788;
  allocator local_779;
  value_type local_778;
  _Base_ptr local_758;
  undefined1 local_750;
  allocator local_741;
  value_type local_740;
  _Base_ptr local_720;
  undefined1 local_718;
  allocator local_709;
  value_type local_708;
  _Base_ptr local_6e8;
  undefined1 local_6e0;
  allocator local_6d1;
  value_type local_6d0;
  _Base_ptr local_6b0;
  undefined1 local_6a8;
  allocator local_699;
  value_type local_698;
  _Base_ptr local_678;
  undefined1 local_670;
  allocator local_661;
  value_type local_660;
  _Base_ptr local_640;
  undefined1 local_638;
  allocator local_629;
  value_type local_628;
  _Base_ptr local_608;
  undefined1 local_600;
  allocator local_5f1;
  value_type local_5f0;
  _Base_ptr local_5d0;
  undefined1 local_5c8;
  allocator local_5b9;
  value_type local_5b8;
  _Base_ptr local_598;
  undefined1 local_590;
  allocator local_581;
  value_type local_580;
  _Base_ptr local_560;
  undefined1 local_558;
  allocator local_549;
  value_type local_548;
  _Base_ptr local_528;
  undefined1 local_520;
  allocator local_511;
  value_type local_510;
  _Base_ptr local_4f0;
  undefined1 local_4e8;
  allocator local_4d9;
  value_type local_4d8;
  _Base_ptr local_4b8;
  undefined1 local_4b0;
  allocator local_4a1;
  value_type local_4a0;
  _Base_ptr local_480;
  undefined1 local_478;
  allocator local_469;
  value_type local_468;
  _Base_ptr local_448;
  undefined1 local_440;
  allocator local_431;
  value_type local_430;
  _Base_ptr local_410;
  undefined1 local_408;
  allocator local_3f9;
  value_type local_3f8;
  _Base_ptr local_3d8;
  undefined1 local_3d0;
  allocator local_3c1;
  value_type local_3c0;
  _Base_ptr local_3a0;
  undefined1 local_398;
  allocator local_389;
  value_type local_388;
  _Base_ptr local_368;
  undefined1 local_360;
  allocator local_351;
  value_type local_350;
  _Base_ptr local_330;
  undefined1 local_328;
  allocator local_319;
  value_type local_318;
  _Base_ptr local_2f8;
  undefined1 local_2f0;
  allocator local_2e1;
  value_type local_2e0;
  _Base_ptr local_2c0;
  undefined1 local_2b8;
  allocator local_2a9;
  value_type local_2a8;
  _Base_ptr local_288;
  undefined1 local_280;
  allocator local_271;
  value_type local_270;
  _Base_ptr local_250;
  undefined1 local_248;
  allocator local_239;
  value_type local_238;
  _Base_ptr local_218;
  undefined1 local_210;
  allocator local_201;
  value_type local_200;
  _Base_ptr local_1e0;
  undefined1 local_1d8;
  allocator local_1c9;
  value_type local_1c8;
  _Base_ptr local_1a8;
  undefined1 local_1a0;
  allocator local_191;
  value_type local_190;
  _Base_ptr local_170;
  undefined1 local_168;
  allocator local_159;
  value_type local_158;
  _Base_ptr local_138;
  undefined1 local_130;
  allocator local_121;
  value_type local_120;
  _Base_ptr local_100;
  undefined1 local_f8;
  allocator local_e9;
  value_type local_e8;
  _Base_ptr local_c8;
  undefined1 local_c0;
  allocator local_b1;
  value_type local_b0;
  _Base_ptr local_90;
  undefined1 local_88;
  allocator local_79;
  value_type local_78;
  _Base_ptr local_58;
  undefined1 local_50;
  allocator local_31;
  value_type local_30;
  t_swift_generator *local_10;
  t_swift_generator *this_local;
  
  local_10 = this;
  if ((this->gen_cocoa_ & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_30,"__COLUMN__",&local_31);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_30);
    local_58 = (_Base_ptr)pVar1.first._M_node;
    local_50 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_78,"__FILE__",&local_79);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_78);
    local_90 = (_Base_ptr)pVar1.first._M_node;
    local_88 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b0,"__FUNCTION__",&local_b1);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_b0);
    local_c8 = (_Base_ptr)pVar1.first._M_node;
    local_c0 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e8,"__LINE__",&local_e9);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_e8);
    local_100 = (_Base_ptr)pVar1.first._M_node;
    local_f8 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_120,"Any",&local_121);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_120);
    local_138 = (_Base_ptr)pVar1.first._M_node;
    local_130 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_158,"as",&local_159);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_158);
    local_170 = (_Base_ptr)pVar1.first._M_node;
    local_168 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_190,"associatedtype",&local_191);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_190);
    local_1a8 = (_Base_ptr)pVar1.first._M_node;
    local_1a0 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator((allocator<char> *)&local_191);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1c8,"associativity",&local_1c9);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_1c8);
    local_1e0 = (_Base_ptr)pVar1.first._M_node;
    local_1d8 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_200,"break",&local_201);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_200);
    local_218 = (_Base_ptr)pVar1.first._M_node;
    local_210 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_238,"case",&local_239);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_238);
    local_250 = (_Base_ptr)pVar1.first._M_node;
    local_248 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_270,"catch",&local_271);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_270);
    local_288 = (_Base_ptr)pVar1.first._M_node;
    local_280 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2a8,"class",&local_2a9);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_2a8);
    local_2c0 = (_Base_ptr)pVar1.first._M_node;
    local_2b8 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2e0,"continue",&local_2e1);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_2e0);
    local_2f8 = (_Base_ptr)pVar1.first._M_node;
    local_2f0 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_2e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_318,"convenience",&local_319);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_318);
    local_330 = (_Base_ptr)pVar1.first._M_node;
    local_328 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator((allocator<char> *)&local_319);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_350,"default",&local_351);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_350);
    local_368 = (_Base_ptr)pVar1.first._M_node;
    local_360 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_350);
    std::allocator<char>::~allocator((allocator<char> *)&local_351);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_388,"defer",&local_389);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_388);
    local_3a0 = (_Base_ptr)pVar1.first._M_node;
    local_398 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_388);
    std::allocator<char>::~allocator((allocator<char> *)&local_389);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3c0,"deinit",&local_3c1);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_3c0);
    local_3d8 = (_Base_ptr)pVar1.first._M_node;
    local_3d0 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_3c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3f8,"didSet",&local_3f9);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_3f8);
    local_410 = (_Base_ptr)pVar1.first._M_node;
    local_408 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_3f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_430,"do",&local_431);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_430);
    local_448 = (_Base_ptr)pVar1.first._M_node;
    local_440 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_430);
    std::allocator<char>::~allocator((allocator<char> *)&local_431);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_468,"dynamic",&local_469);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_468);
    local_480 = (_Base_ptr)pVar1.first._M_node;
    local_478 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_468);
    std::allocator<char>::~allocator((allocator<char> *)&local_469);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4a0,"dynamicType",&local_4a1);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_4a0);
    local_4b8 = (_Base_ptr)pVar1.first._M_node;
    local_4b0 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_4a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4d8,"else",&local_4d9);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_4d8);
    local_4f0 = (_Base_ptr)pVar1.first._M_node;
    local_4e8 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_4d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_510,"enum",&local_511);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_510);
    local_528 = (_Base_ptr)pVar1.first._M_node;
    local_520 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_510);
    std::allocator<char>::~allocator((allocator<char> *)&local_511);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_548,"extension",&local_549);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_548);
    local_560 = (_Base_ptr)pVar1.first._M_node;
    local_558 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_548);
    std::allocator<char>::~allocator((allocator<char> *)&local_549);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_580,"fallthrough",&local_581);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_580);
    local_598 = (_Base_ptr)pVar1.first._M_node;
    local_590 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_580);
    std::allocator<char>::~allocator((allocator<char> *)&local_581);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5b8,"false",&local_5b9);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_5b8);
    local_5d0 = (_Base_ptr)pVar1.first._M_node;
    local_5c8 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_5b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5f0,"fileprivate",&local_5f1);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_5f0);
    local_608 = (_Base_ptr)pVar1.first._M_node;
    local_600 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_5f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_628,"final",&local_629);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_628);
    local_640 = (_Base_ptr)pVar1.first._M_node;
    local_638 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_628);
    std::allocator<char>::~allocator((allocator<char> *)&local_629);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_660,"for",&local_661);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_660);
    local_678 = (_Base_ptr)pVar1.first._M_node;
    local_670 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_660);
    std::allocator<char>::~allocator((allocator<char> *)&local_661);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_698,"func",&local_699);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_698);
    local_6b0 = (_Base_ptr)pVar1.first._M_node;
    local_6a8 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_698);
    std::allocator<char>::~allocator((allocator<char> *)&local_699);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6d0,"get",&local_6d1);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_6d0);
    local_6e8 = (_Base_ptr)pVar1.first._M_node;
    local_6e0 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_6d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_708,"guard",&local_709);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_708);
    local_720 = (_Base_ptr)pVar1.first._M_node;
    local_718 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_708);
    std::allocator<char>::~allocator((allocator<char> *)&local_709);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_740,"if",&local_741);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_740);
    local_758 = (_Base_ptr)pVar1.first._M_node;
    local_750 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_740);
    std::allocator<char>::~allocator((allocator<char> *)&local_741);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_778,"import",&local_779);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_778);
    local_790 = (_Base_ptr)pVar1.first._M_node;
    local_788 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_778);
    std::allocator<char>::~allocator((allocator<char> *)&local_779);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_7b0,"in",&local_7b1);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_7b0);
    local_7c8 = (_Base_ptr)pVar1.first._M_node;
    local_7c0 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_7b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_7e8,"indirect",&local_7e9);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_7e8);
    local_800 = (_Base_ptr)pVar1.first._M_node;
    local_7f8 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_7e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_7e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_820,"infix",&local_821);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_820);
    local_838 = (_Base_ptr)pVar1.first._M_node;
    local_830 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_820);
    std::allocator<char>::~allocator((allocator<char> *)&local_821);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_858,"init",&local_859);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_858);
    local_870 = (_Base_ptr)pVar1.first._M_node;
    local_868 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_858);
    std::allocator<char>::~allocator((allocator<char> *)&local_859);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_890,"inout",&local_891);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_890);
    local_8a8 = (_Base_ptr)pVar1.first._M_node;
    local_8a0 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_890);
    std::allocator<char>::~allocator((allocator<char> *)&local_891);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_8c8,"internal",&local_8c9);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_8c8);
    local_8e0 = (_Base_ptr)pVar1.first._M_node;
    local_8d8 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_8c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_8c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_900,"is",&local_901);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_900);
    local_918 = (_Base_ptr)pVar1.first._M_node;
    local_910 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_900);
    std::allocator<char>::~allocator((allocator<char> *)&local_901);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_938,"lazy",&local_939);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_938);
    local_950 = (_Base_ptr)pVar1.first._M_node;
    local_948 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_938);
    std::allocator<char>::~allocator((allocator<char> *)&local_939);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_970,"left",&local_971);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_970);
    local_988 = (_Base_ptr)pVar1.first._M_node;
    local_980 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_970);
    std::allocator<char>::~allocator((allocator<char> *)&local_971);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_9a8,"let",&local_9a9);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_9a8);
    local_9c0 = (_Base_ptr)pVar1.first._M_node;
    local_9b8 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_9a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_9a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_9e0,"mutating",&local_9e1);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_9e0);
    local_9f8 = (_Base_ptr)pVar1.first._M_node;
    local_9f0 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_9e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_9e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a18,"nil",&local_a19);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_a18);
    local_a30 = (_Base_ptr)pVar1.first._M_node;
    local_a28 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_a18);
    std::allocator<char>::~allocator((allocator<char> *)&local_a19);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a50,"none",&local_a51);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_a50);
    local_a68 = (_Base_ptr)pVar1.first._M_node;
    local_a60 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_a50);
    std::allocator<char>::~allocator((allocator<char> *)&local_a51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a88,"nonmutating",&local_a89);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_a88);
    local_aa0 = (_Base_ptr)pVar1.first._M_node;
    local_a98 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_a88);
    std::allocator<char>::~allocator((allocator<char> *)&local_a89);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_ac0,"open",&local_ac1);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_ac0);
    local_ad8 = (_Base_ptr)pVar1.first._M_node;
    local_ad0 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_ac0);
    std::allocator<char>::~allocator((allocator<char> *)&local_ac1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_af8,"operator",&local_af9);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_af8);
    local_b10 = (_Base_ptr)pVar1.first._M_node;
    local_b08 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_af8);
    std::allocator<char>::~allocator((allocator<char> *)&local_af9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b30,"optional",&local_b31);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_b30);
    local_b48 = (_Base_ptr)pVar1.first._M_node;
    local_b40 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_b30);
    std::allocator<char>::~allocator((allocator<char> *)&local_b31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b68,"override",&local_b69);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_b68);
    local_b80 = (_Base_ptr)pVar1.first._M_node;
    local_b78 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_b68);
    std::allocator<char>::~allocator((allocator<char> *)&local_b69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_ba0,"postfix",&local_ba1);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_ba0);
    local_bb8 = (_Base_ptr)pVar1.first._M_node;
    local_bb0 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_ba0);
    std::allocator<char>::~allocator((allocator<char> *)&local_ba1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_bd8,"precedence",&local_bd9);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_bd8);
    local_bf0 = (_Base_ptr)pVar1.first._M_node;
    local_be8 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_bd8);
    std::allocator<char>::~allocator((allocator<char> *)&local_bd9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c10,"prefix",&local_c11);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_c10);
    local_c28 = (_Base_ptr)pVar1.first._M_node;
    local_c20 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_c10);
    std::allocator<char>::~allocator((allocator<char> *)&local_c11);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c48,"private",&local_c49);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_c48);
    local_c60 = (_Base_ptr)pVar1.first._M_node;
    local_c58 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_c48);
    std::allocator<char>::~allocator((allocator<char> *)&local_c49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c80,"protocol",&local_c81);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_c80);
    local_c98 = (_Base_ptr)pVar1.first._M_node;
    local_c90 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_c80);
    std::allocator<char>::~allocator((allocator<char> *)&local_c81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_cb8,"Protocol",&local_cb9);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_cb8);
    local_cd0 = (_Base_ptr)pVar1.first._M_node;
    local_cc8 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_cb8);
    std::allocator<char>::~allocator((allocator<char> *)&local_cb9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_cf0,"public",&local_cf1);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_cf0);
    local_d08 = (_Base_ptr)pVar1.first._M_node;
    local_d00 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_cf0);
    std::allocator<char>::~allocator((allocator<char> *)&local_cf1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d28,"repeat",&local_d29);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_d28);
    local_d40 = (_Base_ptr)pVar1.first._M_node;
    local_d38 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_d28);
    std::allocator<char>::~allocator((allocator<char> *)&local_d29);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d60,"required",&local_d61);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_d60);
    local_d78 = (_Base_ptr)pVar1.first._M_node;
    local_d70 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_d60);
    std::allocator<char>::~allocator((allocator<char> *)&local_d61);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d98,"rethrows",&local_d99);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_d98);
    local_db0 = (_Base_ptr)pVar1.first._M_node;
    local_da8 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_d98);
    std::allocator<char>::~allocator((allocator<char> *)&local_d99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_dd0,"return",&local_dd1);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_dd0);
    local_de8 = (_Base_ptr)pVar1.first._M_node;
    local_de0 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_dd0);
    std::allocator<char>::~allocator((allocator<char> *)&local_dd1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e08,"right",&local_e09);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_e08);
    local_e20 = (_Base_ptr)pVar1.first._M_node;
    local_e18 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_e08);
    std::allocator<char>::~allocator((allocator<char> *)&local_e09);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e40,"self",&local_e41);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_e40);
    local_e58 = (_Base_ptr)pVar1.first._M_node;
    local_e50 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_e40);
    std::allocator<char>::~allocator((allocator<char> *)&local_e41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e78,"Self",&local_e79);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_e78);
    local_e90 = (_Base_ptr)pVar1.first._M_node;
    local_e88 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_e78);
    std::allocator<char>::~allocator((allocator<char> *)&local_e79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_eb0,"set",&local_eb1);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_eb0);
    local_ec8 = (_Base_ptr)pVar1.first._M_node;
    local_ec0 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_eb0);
    std::allocator<char>::~allocator((allocator<char> *)&local_eb1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_ee8,"static",&local_ee9);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_ee8);
    local_f00 = (_Base_ptr)pVar1.first._M_node;
    local_ef8 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_ee8);
    std::allocator<char>::~allocator((allocator<char> *)&local_ee9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f20,"struct",&local_f21);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_f20);
    local_f38 = (_Base_ptr)pVar1.first._M_node;
    local_f30 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_f20);
    std::allocator<char>::~allocator((allocator<char> *)&local_f21);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f58,"subscript",&local_f59);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_f58);
    local_f70 = (_Base_ptr)pVar1.first._M_node;
    local_f68 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_f58);
    std::allocator<char>::~allocator((allocator<char> *)&local_f59);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f90,"super",&local_f91);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_f90);
    local_fa8 = (_Base_ptr)pVar1.first._M_node;
    local_fa0 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_f90);
    std::allocator<char>::~allocator((allocator<char> *)&local_f91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_fc8,"switch",&local_fc9);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_fc8);
    local_fe0 = (_Base_ptr)pVar1.first._M_node;
    local_fd8 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_fc8);
    std::allocator<char>::~allocator((allocator<char> *)&local_fc9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1000,"throw",&local_1001);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_1000);
    local_1018 = (_Base_ptr)pVar1.first._M_node;
    local_1010 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_1000);
    std::allocator<char>::~allocator((allocator<char> *)&local_1001);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1038,"throws",&local_1039);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_1038);
    local_1050 = (_Base_ptr)pVar1.first._M_node;
    local_1048 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_1038);
    std::allocator<char>::~allocator((allocator<char> *)&local_1039);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1070,"true",&local_1071);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_1070);
    local_1088 = (_Base_ptr)pVar1.first._M_node;
    local_1080 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_1070);
    std::allocator<char>::~allocator((allocator<char> *)&local_1071);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_10a8,"try",&local_10a9);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_10a8);
    local_10c0 = (_Base_ptr)pVar1.first._M_node;
    local_10b8 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_10a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_10a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_10e0,"Type",&local_10e1);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_10e0);
    local_10f8 = (_Base_ptr)pVar1.first._M_node;
    local_10f0 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_10e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_10e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1118,"typealias",&local_1119);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_1118);
    local_1130 = (_Base_ptr)pVar1.first._M_node;
    local_1128 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_1118);
    std::allocator<char>::~allocator((allocator<char> *)&local_1119);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1150,"unowned",&local_1151);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_1150);
    local_1168 = (_Base_ptr)pVar1.first._M_node;
    local_1160 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_1150);
    std::allocator<char>::~allocator((allocator<char> *)&local_1151);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1188,"var",&local_1189);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_1188);
    local_11a0 = (_Base_ptr)pVar1.first._M_node;
    local_1198 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_1188);
    std::allocator<char>::~allocator((allocator<char> *)&local_1189);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_11c0,"weak",&local_11c1);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_11c0);
    local_11d8 = (_Base_ptr)pVar1.first._M_node;
    local_11d0 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_11c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_11c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_11f8,"where",&local_11f9);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_11f8);
    local_1210 = (_Base_ptr)pVar1.first._M_node;
    local_1208 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_11f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_11f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1230,"while",&local_1231);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_1230);
    local_1248 = (_Base_ptr)pVar1.first._M_node;
    local_1240 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_1230);
    std::allocator<char>::~allocator((allocator<char> *)&local_1231);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1268,"willSet",&local_1269);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_1268);
    local_1280 = (_Base_ptr)pVar1.first._M_node;
    local_1278 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_1268);
    std::allocator<char>::~allocator((allocator<char> *)&local_1269);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_12a0,"Self",&local_12a1);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_12a0);
    local_12b8 = (_Base_ptr)pVar1.first._M_node;
    local_12b0 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_12a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_12a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_12d8,"associatedtype",&local_12d9);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_12d8);
    local_12f0 = (_Base_ptr)pVar1.first._M_node;
    local_12e8 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_12d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_12d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1310,"defer",&local_1311);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_1310);
    local_1328 = (_Base_ptr)pVar1.first._M_node;
    local_1320 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_1310);
    std::allocator<char>::~allocator((allocator<char> *)&local_1311);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1348,"deinit",&local_1349);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_1348);
    local_1360 = (_Base_ptr)pVar1.first._M_node;
    local_1358 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_1348);
    std::allocator<char>::~allocator((allocator<char> *)&local_1349);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1380,"dynamicType",&local_1381);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_1380);
    local_1398 = (_Base_ptr)pVar1.first._M_node;
    local_1390 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_1380);
    std::allocator<char>::~allocator((allocator<char> *)&local_1381);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_13b8,"enum",&local_13b9);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_13b8);
    local_13d0 = (_Base_ptr)pVar1.first._M_node;
    local_13c8 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_13b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_13b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_13f0,"extension",&local_13f1);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_13f0);
    local_1408 = (_Base_ptr)pVar1.first._M_node;
    local_1400 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_13f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_13f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1428,"fallthrough",&local_1429);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_1428);
    local_1440 = (_Base_ptr)pVar1.first._M_node;
    local_1438 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_1428);
    std::allocator<char>::~allocator((allocator<char> *)&local_1429);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1460,"false",&local_1461);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_1460);
    local_1478 = (_Base_ptr)pVar1.first._M_node;
    local_1470 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_1460);
    std::allocator<char>::~allocator((allocator<char> *)&local_1461);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1498,"func",&local_1499);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_1498);
    local_14b0 = (_Base_ptr)pVar1.first._M_node;
    local_14a8 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_1498);
    std::allocator<char>::~allocator((allocator<char> *)&local_1499);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_14d0,"guard",&local_14d1);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_14d0);
    local_14e8 = (_Base_ptr)pVar1.first._M_node;
    local_14e0 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_14d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_14d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1508,"init",&local_1509);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_1508);
    local_1520 = (_Base_ptr)pVar1.first._M_node;
    local_1518 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_1508);
    std::allocator<char>::~allocator((allocator<char> *)&local_1509);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1540,"inout",&local_1541);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_1540);
    local_1558 = (_Base_ptr)pVar1.first._M_node;
    local_1550 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_1540);
    std::allocator<char>::~allocator((allocator<char> *)&local_1541);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1578,"internal",&local_1579);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_1578);
    local_1590 = (_Base_ptr)pVar1.first._M_node;
    local_1588 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_1578);
    std::allocator<char>::~allocator((allocator<char> *)&local_1579);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_15b0,"let",&local_15b1);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_15b0);
    local_15c8 = (_Base_ptr)pVar1.first._M_node;
    local_15c0 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_15b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_15b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_15e8,"operator",&local_15e9);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_15e8);
    local_1600 = (_Base_ptr)pVar1.first._M_node;
    local_15f8 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_15e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_15e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1620,"protocol",&local_1621);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_1620);
    local_1638 = (_Base_ptr)pVar1.first._M_node;
    local_1630 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_1620);
    std::allocator<char>::~allocator((allocator<char> *)&local_1621);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1658,"repeat",&local_1659);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_1658);
    local_1670 = (_Base_ptr)pVar1.first._M_node;
    local_1668 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_1658);
    std::allocator<char>::~allocator((allocator<char> *)&local_1659);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1690,"rethrows",&local_1691);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_1690);
    local_16a8 = (_Base_ptr)pVar1.first._M_node;
    local_16a0 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_1690);
    std::allocator<char>::~allocator((allocator<char> *)&local_1691);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_16c8,"struct",&local_16c9);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_16c8);
    local_16e0 = (_Base_ptr)pVar1.first._M_node;
    local_16d8 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_16c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_16c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1700,"subscript",&local_1701);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_1700);
    local_1718 = (_Base_ptr)pVar1.first._M_node;
    local_1710 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_1700);
    std::allocator<char>::~allocator((allocator<char> *)&local_1701);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1738,"throws",&local_1739);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_1738);
    local_1750 = (_Base_ptr)pVar1.first._M_node;
    local_1748 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_1738);
    std::allocator<char>::~allocator((allocator<char> *)&local_1739);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1770,"true",&local_1771);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_1770);
    local_1788 = (_Base_ptr)pVar1.first._M_node;
    local_1780 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_1770);
    std::allocator<char>::~allocator((allocator<char> *)&local_1771);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_17a8,"typealias",&local_17a9);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->swift_reserved_words_,&local_17a8);
    local_17c0 = (_Base_ptr)pVar1.first._M_node;
    local_17b8 = pVar1.second;
    std::__cxx11::string::~string((string *)&local_17a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_17a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_17e0,"where",&local_17e1);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&this->swift_reserved_words_,&local_17e0);
    std::__cxx11::string::~string((string *)&local_17e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_17e1);
  }
  return;
}

Assistant:

void t_swift_generator::populate_reserved_words() {
  if (!gen_cocoa_) {
    swift_reserved_words_.insert("__COLUMN__");
    swift_reserved_words_.insert("__FILE__");
    swift_reserved_words_.insert("__FUNCTION__");
    swift_reserved_words_.insert("__LINE__");
    swift_reserved_words_.insert("Any");
    swift_reserved_words_.insert("as");
    swift_reserved_words_.insert("associatedtype");
    swift_reserved_words_.insert("associativity");
    swift_reserved_words_.insert("break");
    swift_reserved_words_.insert("case");
    swift_reserved_words_.insert("catch");
    swift_reserved_words_.insert("class");
    swift_reserved_words_.insert("continue");
    swift_reserved_words_.insert("convenience");
    swift_reserved_words_.insert("default");
    swift_reserved_words_.insert("defer");
    swift_reserved_words_.insert("deinit");
    swift_reserved_words_.insert("didSet");
    swift_reserved_words_.insert("do");
    swift_reserved_words_.insert("dynamic");
    swift_reserved_words_.insert("dynamicType");
    swift_reserved_words_.insert("else");
    swift_reserved_words_.insert("enum");
    swift_reserved_words_.insert("extension");
    swift_reserved_words_.insert("fallthrough");
    swift_reserved_words_.insert("false");
    swift_reserved_words_.insert("fileprivate");
    swift_reserved_words_.insert("final");
    swift_reserved_words_.insert("for");
    swift_reserved_words_.insert("func");
    swift_reserved_words_.insert("get");
    swift_reserved_words_.insert("guard");
    swift_reserved_words_.insert("if");
    swift_reserved_words_.insert("import");
    swift_reserved_words_.insert("in");
    swift_reserved_words_.insert("indirect");
    swift_reserved_words_.insert("infix");
    swift_reserved_words_.insert("init");
    swift_reserved_words_.insert("inout");
    swift_reserved_words_.insert("internal");
    swift_reserved_words_.insert("is");
    swift_reserved_words_.insert("lazy");
    swift_reserved_words_.insert("left");
    swift_reserved_words_.insert("let");
    swift_reserved_words_.insert("mutating");
    swift_reserved_words_.insert("nil");
    swift_reserved_words_.insert("none");
    swift_reserved_words_.insert("nonmutating");
    swift_reserved_words_.insert("open");
    swift_reserved_words_.insert("operator");
    swift_reserved_words_.insert("optional");
    swift_reserved_words_.insert("override");
    swift_reserved_words_.insert("postfix");
    swift_reserved_words_.insert("precedence");
    swift_reserved_words_.insert("prefix");
    swift_reserved_words_.insert("private");
    swift_reserved_words_.insert("protocol");
    swift_reserved_words_.insert("Protocol");
    swift_reserved_words_.insert("public");
    swift_reserved_words_.insert("repeat");
    swift_reserved_words_.insert("required");
    swift_reserved_words_.insert("rethrows");
    swift_reserved_words_.insert("return");
    swift_reserved_words_.insert("right");
    swift_reserved_words_.insert("self");
    swift_reserved_words_.insert("Self");
    swift_reserved_words_.insert("set");
    swift_reserved_words_.insert("static");
    swift_reserved_words_.insert("struct");
    swift_reserved_words_.insert("subscript");
    swift_reserved_words_.insert("super");
    swift_reserved_words_.insert("switch");
    swift_reserved_words_.insert("throw");
    swift_reserved_words_.insert("throws");
    swift_reserved_words_.insert("true");
    swift_reserved_words_.insert("try");
    swift_reserved_words_.insert("Type");
    swift_reserved_words_.insert("typealias");
    swift_reserved_words_.insert("unowned");
    swift_reserved_words_.insert("var");
    swift_reserved_words_.insert("weak");
    swift_reserved_words_.insert("where");
    swift_reserved_words_.insert("while");
    swift_reserved_words_.insert("willSet");
  } else {
    swift_reserved_words_.insert("Self");
    swift_reserved_words_.insert("associatedtype");
    swift_reserved_words_.insert("defer");
    swift_reserved_words_.insert("deinit");
    swift_reserved_words_.insert("dynamicType");
    swift_reserved_words_.insert("enum");
    swift_reserved_words_.insert("extension");
    swift_reserved_words_.insert("fallthrough");
    swift_reserved_words_.insert("false");
    swift_reserved_words_.insert("func");
    swift_reserved_words_.insert("guard");
    swift_reserved_words_.insert("init");
    swift_reserved_words_.insert("inout");
    swift_reserved_words_.insert("internal");
    swift_reserved_words_.insert("let");
    swift_reserved_words_.insert("operator");
    swift_reserved_words_.insert("protocol");
    swift_reserved_words_.insert("repeat");
    swift_reserved_words_.insert("rethrows");
    swift_reserved_words_.insert("struct");
    swift_reserved_words_.insert("subscript");
    swift_reserved_words_.insert("throws");
    swift_reserved_words_.insert("true");
    swift_reserved_words_.insert("typealias");
    swift_reserved_words_.insert("where");
  }
}